

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.h
# Opt level: O0

double __thiscall HighsImplications::VarBound::minValue(VarBound *this)

{
  double *in_RDI;
  double dVar1;
  HighsCDouble *this_00;
  HighsCDouble local_28;
  HighsCDouble local_18;
  
  HighsCDouble::HighsCDouble(&local_28,in_RDI[1]);
  this_00 = (HighsCDouble *)0x0;
  std::min<double>(in_RDI,(double *)&stack0xffffffffffffffd0);
  local_18 = HighsCDouble::operator+(this_00,(double)in_RDI);
  dVar1 = HighsCDouble::operator_cast_to_double(&local_18);
  return dVar1;
}

Assistant:

double minValue() const {
      return static_cast<double>(static_cast<HighsCDouble>(constant) +
                                 std::min(coef, 0.0));
    }